

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.hpp
# Opt level: O1

ostream * plot::detail::operator<<(ostream *stream,value_type *line)

{
  TerminalMode TVar1;
  Frame<plot::BrailleCanvas_*> *pFVar2;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  ostream *poVar7;
  size_t sVar8;
  size_t sVar9;
  char *pcVar10;
  label_line local_88;
  size_t local_78;
  char *pcStack_70;
  Label local_60;
  
  pFVar2 = line->frame_;
  sVar9 = pFVar2->block_->cols_;
  sVar8 = (pFVar2->border_).top_left._M_len;
  pcVar10 = (pFVar2->border_).top_left._M_str;
  local_78 = (pFVar2->border_).top._M_len;
  pcStack_70 = (pFVar2->border_).top._M_str;
  if (line->overflow_ < 0) {
    sVar3 = (pFVar2->border_).top_right._M_len;
    pcVar4 = (pFVar2->border_).top_right._M_str;
    local_60.text_._M_len = (pFVar2->label_)._M_len;
    local_60.text_._M_str = (pFVar2->label_)._M_str;
    local_60.align_ = pFVar2->align_;
    local_88.label_ = &local_60;
    local_88.overflow_ = 0;
    TVar1 = (pFVar2->term_).mode;
    local_60.width_ = sVar9;
    local_60.fill_._M_len = local_78;
    local_60.fill_._M_str = pcStack_70;
    if ((TVar1 != None) && (TVar1 != Windows)) {
      std::__ostream_insert<char,std::char_traits<char>>(stream,"\x1b[0m",4);
    }
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar10,sVar8);
    poVar7 = operator<<(poVar7,&local_88);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar4,sVar3);
    return poVar7;
  }
  TVar1 = (pFVar2->term_).mode;
  if ((line->line_).line_.it_._M_current == (line->end_).line_.it_._M_current) {
    sVar3 = (pFVar2->border_).bottom_left._M_len;
    pcVar4 = (pFVar2->border_).bottom_left._M_str;
    sVar5 = (pFVar2->border_).bottom._M_len;
    pcVar6 = (pFVar2->border_).bottom._M_str;
    sVar8 = (pFVar2->border_).bottom_right._M_len;
    pcVar10 = (pFVar2->border_).bottom_right._M_str;
    if ((TVar1 != None) && (TVar1 != Windows)) {
      std::__ostream_insert<char,std::char_traits<char>>(stream,"\x1b[0m",4);
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar4,sVar3);
    if (0 < (long)sVar9) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar6,sVar5);
        sVar9 = sVar9 - 1;
      } while (sVar9 != 0);
    }
  }
  else {
    if ((TVar1 != None) && (TVar1 != Windows)) {
      std::__ostream_insert<char,std::char_traits<char>>(stream,"\x1b[0m",4);
    }
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (stream,(line->frame_->border_).left._M_str,
                        (line->frame_->border_).left._M_len);
    stream = braille::operator<<(poVar7,&(line->line_).line_);
    TVar1 = (line->frame_->term_).mode;
    if ((TVar1 != None) && (TVar1 != Windows)) {
      std::__ostream_insert<char,std::char_traits<char>>(stream,"\x1b[0m",4);
    }
    sVar8 = (line->frame_->border_).right._M_len;
    pcVar10 = (line->frame_->border_).right._M_str;
  }
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar10,sVar8);
  return poVar7;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, frame_line<Block> const& line) {
        auto size = detail::block_traits<Block>::size(line.frame_->block_);
        auto const border = line.frame_->border_;

        if (line.overflow_ < 0) {
            auto lbl = label(line.frame_->label_, line.frame_->align_, size.x, border.top);
            auto lbl_line = *lbl.cbegin();

            return stream << line.frame_->term_.reset()
                          << border.top_left << lbl_line << border.top_right;
        } else if (line.line_ == line.end_) {
            stream << line.frame_->term_.reset() << border.bottom_left;

            for (auto i = 0; i < size.x; ++i)
                stream << border.bottom;

            return stream << border.bottom_right;
        }

        return stream << line.frame_->term_.reset()
                      << line.frame_->border_.left
                      << *line.line_
                      << line.frame_->term_.reset()
                      << line.frame_->border_.right;
    }